

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,SkelAnimation *skelanim,uint32_t indent,
          bool closing_brace)

{
  optional<tinyusdz::Interpolation> oVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar5;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  undefined3 in_register_00000081;
  uint32_t uVar6;
  uint indent_00;
  stringstream ss;
  string local_210;
  undefined1 local_1f0 [56];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar6 = CONCAT31(in_register_00000081,closing_brace);
  local_1f0._36_4_ = indent;
  local_1f0._48_8_ = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)skelanim & 0xffffffff),n);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  to_string_abi_cxx11_((string *)local_1f0,(tinyusdz *)(ulong)*(uint *)(this + 0x20),s);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_1f0._0_8_,local_1f0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," SkelAnimation \"",0x10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)this,*(long *)(this + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
  oVar1 = (optional<tinyusdz::Interpolation>)((long)local_1f0 + 0x10);
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  bVar3 = PrimMetas::authored((PrimMetas *)(this + 0xf50));
  uVar5 = n_00;
  if (bVar3) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)skelanim & 0xffffffff),n_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_
              (&local_210,this + 0xf50,(PrimMeta *)(ulong)((int)skelanim + 1),indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    uVar5 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)skelanim & 0xffffffff),uVar5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    uVar5 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)skelanim & 0xffffffff),uVar5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_1f0._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"blendShapes","");
  indent_00 = (int)skelanim + 1;
  local_1f0._40_8_ = (pprint *)((ulong)skelanim & 0xffffffff);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_210,this + 0x30,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_1f0,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"blendShapeWeights","");
  print_typed_attr<std::vector<float,std::allocator<float>>>
            (&local_210,this + 0x280,
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_1f0,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"joints","");
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_210,this + 0x4f8,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_1f0,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"rotations","");
  print_typed_attr<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
            (&local_210,this + 0x748,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              *)local_1f0,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"scales","");
  print_typed_attr<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
            (&local_210,this + 0x9c0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
              *)local_1f0,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"translations","");
  print_typed_attr<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
            (&local_210,this + 0xc38,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              *)local_1f0,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  uVar2 = local_1f0._40_8_;
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  print_props(&local_210,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0xf20),indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  uVar6 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    uVar6 = extraout_EDX_04;
  }
  if (local_1f0[0x24] != '\0') {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)(uVar2 & 0xffffffff),uVar6);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = local_1f0._48_8_;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return (string *)uVar2;
}

Assistant:

std::string to_string(const SkelAnimation &skelanim, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(skelanim.spec)
     << " SkelAnimation \"" << skelanim.name << "\"\n";
  if (skelanim.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(skelanim.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_attr(skelanim.blendShapes, "blendShapes", indent + 1);
  ss << print_typed_attr(skelanim.blendShapeWeights, "blendShapeWeights",
                         indent + 1);
  ss << print_typed_attr(skelanim.joints, "joints", indent + 1);
  ss << print_typed_attr(skelanim.rotations, "rotations", indent + 1);
  ss << print_typed_attr(skelanim.scales, "scales", indent + 1);
  ss << print_typed_attr(skelanim.translations, "translations", indent + 1);

  ss << print_props(skelanim.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}